

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void read_ref_pic_list_reordering(h264_stream_t *h,bs_t *b)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  slice_header_t *psVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  byte *pbVar10;
  long lVar11;
  uint uVar12;
  int *piVar13;
  uint uVar14;
  bool bVar15;
  
  psVar4 = h->sh;
  iVar3 = psVar4->slice_type;
  iVar8 = iVar3 + -5;
  if (iVar3 < 5) {
    iVar8 = iVar3;
  }
  if ((iVar8 != 2) && (iVar8 != 4)) {
    uVar9 = b->bits_left - 1;
    b->bits_left = uVar9;
    pbVar10 = b->p;
    pbVar5 = b->end;
    uVar6 = 0;
    if (pbVar10 < pbVar5) {
      uVar6 = (uint)((*pbVar10 >> (uVar9 & 0x1f) & 1) != 0);
    }
    if (uVar9 == 0) {
      b->p = pbVar10 + 1;
      b->bits_left = 8;
    }
    (psVar4->rplr).ref_pic_list_reordering_flag_l0 = uVar6;
    if (uVar6 != 0) {
      pbVar10 = b->p;
      piVar1 = (psVar4->rplr).reorder_l0.long_term_pic_num;
      piVar2 = (psVar4->rplr).reorder_l0.abs_diff_pic_num_minus1;
      lVar11 = -1;
      do {
        uVar6 = b->bits_left;
        uVar9 = 0xffffffff;
        iVar3 = -2;
        do {
          iVar8 = iVar3;
          uVar7 = uVar9;
          uVar6 = uVar6 - 1;
          b->bits_left = uVar6;
          bVar15 = true;
          if (pbVar10 < pbVar5) {
            bVar15 = (*pbVar10 >> (uVar6 & 0x1f) & 1) == 0;
          }
          if (uVar6 == 0) {
            pbVar10 = pbVar10 + 1;
            b->p = pbVar10;
            b->bits_left = 8;
            uVar6 = 8;
          }
          uVar9 = uVar7 + 1;
        } while (((bool)(bVar15 & uVar9 < 0x20)) && (iVar3 = iVar8 + 1, pbVar10 < pbVar5));
        if (uVar9 == 0) {
          uVar6 = 0;
        }
        else {
          uVar12 = b->bits_left;
          uVar6 = 0;
          do {
            uVar12 = uVar12 - 1;
            b->bits_left = uVar12;
            uVar14 = 0;
            if (pbVar10 < pbVar5) {
              uVar14 = (uint)((*pbVar10 >> (uVar12 & 0x1f) & 1) != 0);
            }
            if (uVar12 == 0) {
              pbVar10 = pbVar10 + 1;
              b->p = pbVar10;
              b->bits_left = 8;
              uVar12 = 8;
            }
            uVar6 = uVar6 | uVar14 << ((byte)uVar7 & 0x1f);
            uVar7 = uVar7 - 1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != -2);
        }
        uVar6 = ~(-1 << ((byte)uVar9 & 0x1f)) + uVar6;
        (psVar4->rplr).reorder_l0.reordering_of_pic_nums_idc[lVar11 + 1] = uVar6;
        if (uVar6 < 2) {
          uVar6 = b->bits_left;
          uVar9 = 0xffffffff;
          iVar3 = -2;
          do {
            iVar8 = iVar3;
            uVar7 = uVar9;
            uVar6 = uVar6 - 1;
            b->bits_left = uVar6;
            bVar15 = true;
            if (pbVar10 < pbVar5) {
              bVar15 = (*pbVar10 >> (uVar6 & 0x1f) & 1) == 0;
            }
            if (uVar6 == 0) {
              pbVar10 = pbVar10 + 1;
              b->p = pbVar10;
              b->bits_left = 8;
              uVar6 = 8;
            }
            uVar9 = uVar7 + 1;
          } while (((bool)(bVar15 & uVar9 < 0x20)) && (iVar3 = iVar8 + 1, pbVar10 < pbVar5));
          piVar13 = piVar2;
          if (uVar9 == 0) {
            uVar6 = 0;
          }
          else {
            uVar12 = b->bits_left;
            uVar6 = 0;
            do {
              uVar12 = uVar12 - 1;
              b->bits_left = uVar12;
              uVar14 = 0;
              if (pbVar10 < pbVar5) {
                uVar14 = (uint)((*pbVar10 >> (uVar12 & 0x1f) & 1) != 0);
              }
              if (uVar12 == 0) {
                pbVar10 = pbVar10 + 1;
                b->p = pbVar10;
                b->bits_left = 8;
                uVar12 = 8;
              }
              uVar6 = uVar6 | uVar14 << ((byte)uVar7 & 0x1f);
              uVar7 = uVar7 - 1;
              iVar8 = iVar8 + -1;
            } while (iVar8 != -2);
          }
LAB_0012a989:
          piVar13[lVar11 + 1] = ~(-1 << ((byte)uVar9 & 0x1f)) + uVar6;
        }
        else if (uVar6 == 2) {
          uVar6 = b->bits_left;
          uVar9 = 0xffffffff;
          iVar3 = -2;
          do {
            iVar8 = iVar3;
            uVar7 = uVar9;
            uVar6 = uVar6 - 1;
            b->bits_left = uVar6;
            bVar15 = true;
            if (pbVar10 < pbVar5) {
              bVar15 = (*pbVar10 >> (uVar6 & 0x1f) & 1) == 0;
            }
            if (uVar6 == 0) {
              pbVar10 = pbVar10 + 1;
              b->p = pbVar10;
              b->bits_left = 8;
              uVar6 = 8;
            }
            uVar9 = uVar7 + 1;
          } while (((bool)(bVar15 & uVar9 < 0x20)) && (iVar3 = iVar8 + 1, pbVar10 < pbVar5));
          piVar13 = piVar1;
          if (uVar9 == 0) {
            uVar6 = 0;
          }
          else {
            uVar12 = b->bits_left;
            uVar6 = 0;
            do {
              uVar12 = uVar12 - 1;
              b->bits_left = uVar12;
              uVar14 = 0;
              if (pbVar10 < pbVar5) {
                uVar14 = (uint)((*pbVar10 >> (uVar12 & 0x1f) & 1) != 0);
              }
              if (uVar12 == 0) {
                pbVar10 = pbVar10 + 1;
                b->p = pbVar10;
                b->bits_left = 8;
                uVar12 = 8;
              }
              uVar6 = uVar6 | uVar14 << ((byte)uVar7 & 0x1f);
              uVar7 = uVar7 - 1;
              iVar8 = iVar8 + -1;
            } while (iVar8 != -2);
          }
          goto LAB_0012a989;
        }
      } while (((psVar4->rplr).reorder_l0.reordering_of_pic_nums_idc[lVar11 + 1] != 3) &&
              (lVar11 = lVar11 + 1, pbVar10 < pbVar5));
    }
  }
  iVar3 = psVar4->slice_type;
  iVar8 = iVar3 + -5;
  if (iVar3 < 5) {
    iVar8 = iVar3;
  }
  if (iVar8 == 1) {
    uVar9 = b->bits_left - 1;
    b->bits_left = uVar9;
    pbVar10 = b->p;
    pbVar5 = b->end;
    uVar6 = 0;
    if (pbVar10 < pbVar5) {
      uVar6 = (uint)((*pbVar10 >> (uVar9 & 0x1f) & 1) != 0);
    }
    if (uVar9 == 0) {
      b->p = pbVar10 + 1;
      b->bits_left = 8;
    }
    (psVar4->rplr).ref_pic_list_reordering_flag_l1 = uVar6;
    if (uVar6 != 0) {
      pbVar10 = b->p;
      piVar1 = (psVar4->rplr).reorder_l1.long_term_pic_num;
      piVar2 = (psVar4->rplr).reorder_l1.abs_diff_pic_num_minus1;
      lVar11 = -1;
      do {
        uVar6 = b->bits_left;
        uVar9 = 0xffffffff;
        iVar3 = -2;
        do {
          iVar8 = iVar3;
          uVar7 = uVar9;
          uVar6 = uVar6 - 1;
          b->bits_left = uVar6;
          bVar15 = true;
          if (pbVar10 < pbVar5) {
            bVar15 = (*pbVar10 >> (uVar6 & 0x1f) & 1) == 0;
          }
          if (uVar6 == 0) {
            pbVar10 = pbVar10 + 1;
            b->p = pbVar10;
            b->bits_left = 8;
            uVar6 = 8;
          }
          uVar9 = uVar7 + 1;
        } while (((bool)(bVar15 & uVar9 < 0x20)) && (iVar3 = iVar8 + 1, pbVar10 < pbVar5));
        if (uVar9 == 0) {
          uVar6 = 0;
        }
        else {
          uVar12 = b->bits_left;
          uVar6 = 0;
          do {
            uVar12 = uVar12 - 1;
            b->bits_left = uVar12;
            uVar14 = 0;
            if (pbVar10 < pbVar5) {
              uVar14 = (uint)((*pbVar10 >> (uVar12 & 0x1f) & 1) != 0);
            }
            if (uVar12 == 0) {
              pbVar10 = pbVar10 + 1;
              b->p = pbVar10;
              b->bits_left = 8;
              uVar12 = 8;
            }
            uVar6 = uVar6 | uVar14 << ((byte)uVar7 & 0x1f);
            uVar7 = uVar7 - 1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != -2);
        }
        uVar6 = ~(-1 << ((byte)uVar9 & 0x1f)) + uVar6;
        (psVar4->rplr).reorder_l1.reordering_of_pic_nums_idc[lVar11 + 1] = uVar6;
        if (uVar6 < 2) {
          uVar6 = b->bits_left;
          uVar9 = 0xffffffff;
          iVar3 = -2;
          do {
            iVar8 = iVar3;
            uVar7 = uVar9;
            uVar6 = uVar6 - 1;
            b->bits_left = uVar6;
            bVar15 = true;
            if (pbVar10 < pbVar5) {
              bVar15 = (*pbVar10 >> (uVar6 & 0x1f) & 1) == 0;
            }
            if (uVar6 == 0) {
              pbVar10 = pbVar10 + 1;
              b->p = pbVar10;
              b->bits_left = 8;
              uVar6 = 8;
            }
            uVar9 = uVar7 + 1;
          } while (((bool)(bVar15 & uVar9 < 0x20)) && (iVar3 = iVar8 + 1, pbVar10 < pbVar5));
          piVar13 = piVar2;
          if (uVar9 == 0) {
            uVar6 = 0;
          }
          else {
            uVar12 = b->bits_left;
            uVar6 = 0;
            do {
              uVar12 = uVar12 - 1;
              b->bits_left = uVar12;
              uVar14 = 0;
              if (pbVar10 < pbVar5) {
                uVar14 = (uint)((*pbVar10 >> (uVar12 & 0x1f) & 1) != 0);
              }
              if (uVar12 == 0) {
                pbVar10 = pbVar10 + 1;
                b->p = pbVar10;
                b->bits_left = 8;
                uVar12 = 8;
              }
              uVar6 = uVar6 | uVar14 << ((byte)uVar7 & 0x1f);
              uVar7 = uVar7 - 1;
              iVar8 = iVar8 + -1;
            } while (iVar8 != -2);
          }
LAB_0012ac71:
          piVar13[lVar11 + 1] = ~(-1 << ((byte)uVar9 & 0x1f)) + uVar6;
        }
        else if (uVar6 == 2) {
          uVar6 = b->bits_left;
          uVar9 = 0xffffffff;
          iVar3 = -2;
          do {
            iVar8 = iVar3;
            uVar7 = uVar9;
            uVar6 = uVar6 - 1;
            b->bits_left = uVar6;
            bVar15 = true;
            if (pbVar10 < pbVar5) {
              bVar15 = (*pbVar10 >> (uVar6 & 0x1f) & 1) == 0;
            }
            if (uVar6 == 0) {
              pbVar10 = pbVar10 + 1;
              b->p = pbVar10;
              b->bits_left = 8;
              uVar6 = 8;
            }
            uVar9 = uVar7 + 1;
          } while (((bool)(bVar15 & uVar9 < 0x20)) && (iVar3 = iVar8 + 1, pbVar10 < pbVar5));
          piVar13 = piVar1;
          if (uVar9 == 0) {
            uVar6 = 0;
          }
          else {
            uVar12 = b->bits_left;
            uVar6 = 0;
            do {
              uVar12 = uVar12 - 1;
              b->bits_left = uVar12;
              uVar14 = 0;
              if (pbVar10 < pbVar5) {
                uVar14 = (uint)((*pbVar10 >> (uVar12 & 0x1f) & 1) != 0);
              }
              if (uVar12 == 0) {
                pbVar10 = pbVar10 + 1;
                b->p = pbVar10;
                b->bits_left = 8;
                uVar12 = 8;
              }
              uVar6 = uVar6 | uVar14 << ((byte)uVar7 & 0x1f);
              uVar7 = uVar7 - 1;
              iVar8 = iVar8 + -1;
            } while (iVar8 != -2);
          }
          goto LAB_0012ac71;
        }
      } while (((psVar4->rplr).reorder_l1.reordering_of_pic_nums_idc[lVar11 + 1] != 3) &&
              (lVar11 = lVar11 + 1, pbVar10 < pbVar5));
    }
  }
  return;
}

Assistant:

void read_ref_pic_list_reordering(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    // FIXME should be an array

    if( ! is_slice_type( sh->slice_type, SH_SLICE_TYPE_I ) && ! is_slice_type( sh->slice_type, SH_SLICE_TYPE_SI ) )
    {
        sh->rplr.ref_pic_list_reordering_flag_l0 = bs_read_u1(b);
        if( sh->rplr.ref_pic_list_reordering_flag_l0 )
        {
            int n = -1;
            do
            {
                n++;
                sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] = bs_read_ue(b);
                if( sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] == 0 ||
                    sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] == 1 )
                {
                    sh->rplr.reorder_l0.abs_diff_pic_num_minus1[ n ] = bs_read_ue(b);
                }
                else if( sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] == 2 )
                {
                    sh->rplr.reorder_l0.long_term_pic_num[ n ] = bs_read_ue(b);
                }
            } while( sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] != 3 && ! bs_eof(b) );
        }
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        sh->rplr.ref_pic_list_reordering_flag_l1 = bs_read_u1(b);
        if( sh->rplr.ref_pic_list_reordering_flag_l1 )
        {
            int n = -1;
            do
            {
                n++;
                sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] = bs_read_ue(b);
                if( sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] == 0 ||
                    sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] == 1 )
                {
                    sh->rplr.reorder_l1.abs_diff_pic_num_minus1[ n ] = bs_read_ue(b);
                }
                else if( sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] == 2 )
                {
                    sh->rplr.reorder_l1.long_term_pic_num[ n ] = bs_read_ue(b);
                }
            } while( sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] != 3 && ! bs_eof(b) );
        }
    }
}